

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStemsEx<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<unsigned_short> *get_mark,GetterYRef *get_base)

{
  GetterYs<unsigned_short> getter;
  GetterYs<unsigned_short> getter_00;
  GetterYs<unsigned_short> getter_01;
  GetterYs<unsigned_short> getter_02;
  GetterYRef *getter2;
  GetterYRef *getter1;
  bool bVar1;
  ImPlotScale IVar2;
  ImU32 local_184;
  TransformerLogLog local_134;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  TransformerLinLog local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  TransformerLogLin local_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  TransformerLinLin local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  ImU32 local_78;
  ImU32 local_74;
  ImU32 col_fill;
  ImU32 col_line_1;
  ImPlotMarker marker;
  TransformerLogLin local_64;
  TransformerLinLin local_60;
  ImU32 local_5c;
  ImDrawList *pIStack_58;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint local_38;
  int local_24;
  GetterYRef *pGStack_20;
  int i;
  GetterYRef *get_base_local;
  GetterYs<unsigned_short> *get_mark_local;
  char *label_id_local;
  
  pGStack_20 = get_base;
  get_base_local = (GetterYRef *)get_mark;
  get_mark_local = (GetterYs<unsigned_short> *)label_id;
  bVar1 = BeginItem(label_id,0);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (local_24 = 0; local_24 < pGStack_20->Count; local_24 = local_24 + 1) {
        local_38 = GetterYs<unsigned_short>::operator()
                             ((GetterYs<unsigned_short> *)get_base_local,local_24);
        FitPoint(&local_38);
        _s = GetterYRef::operator()(pGStack_20,local_24);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_58 = GetPlotDrawList();
    if (((ulong)(DrawList->_TextureIdStack).Data & 0x100000000) != 0) {
      local_5c = ImGui::GetColorU32((ImVec4 *)DrawList);
      IVar2 = GetCurrentScale();
      getter1 = get_base_local;
      getter2 = pGStack_20;
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_60);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>
                  ((GetterYs<unsigned_short> *)getter1,getter2,&local_60,pIStack_58,
                   *(float *)&DrawList->_IdxWritePtr,local_5c);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_64);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>
                  ((GetterYs<unsigned_short> *)getter1,getter2,&local_64,pIStack_58,
                   *(float *)&DrawList->_IdxWritePtr,local_5c);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog((TransformerLinLog *)&marker);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>
                  ((GetterYs<unsigned_short> *)getter1,getter2,(TransformerLinLog *)&marker,
                   pIStack_58,*(float *)&DrawList->_IdxWritePtr,local_5c);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog((TransformerLogLog *)&col_line_1);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>
                  ((GetterYs<unsigned_short> *)getter1,getter2,(TransformerLogLog *)&col_line_1,
                   pIStack_58,*(float *)&DrawList->_IdxWritePtr,local_5c);
      }
    }
    if (*(int *)((long)&DrawList->_IdxWritePtr + 4) == -1) {
      local_184 = 0;
    }
    else {
      local_184 = *(ImU32 *)((long)&DrawList->_IdxWritePtr + 4);
    }
    col_fill = local_184;
    if (local_184 != 0xffffffff) {
      local_74 = ImGui::GetColorU32((ImVec4 *)&DrawList->VtxBuffer);
      local_78 = ImGui::GetColorU32((ImVec4 *)&DrawList->Flags);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        memcpy(&local_a0,get_base_local,0x28);
        TransformerLinLin::TransformerLinLin(&local_a4);
        getter._8_8_ = uStack_98;
        getter.Ys = (unsigned_short *)local_a0;
        getter.XScale = (double)local_90;
        getter.X0 = (double)uStack_88;
        getter.Offset = (undefined4)local_80;
        getter.Stride = local_80._4_4_;
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_short>>
                  (getter,local_a4,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
        break;
      case 1:
        memcpy(&local_d0,get_base_local,0x28);
        TransformerLogLin::TransformerLogLin(&local_d4);
        getter_00._8_8_ = uStack_c8;
        getter_00.Ys = (unsigned_short *)local_d0;
        getter_00.XScale = (double)local_c0;
        getter_00.X0 = (double)uStack_b8;
        getter_00.Offset = (undefined4)local_b0;
        getter_00.Stride = local_b0._4_4_;
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_short>>
                  (getter_00,local_d4,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
        break;
      case 2:
        memcpy(&local_100,get_base_local,0x28);
        TransformerLinLog::TransformerLinLog(&local_104);
        getter_01._8_8_ = uStack_f8;
        getter_01.Ys = (unsigned_short *)local_100;
        getter_01.XScale = (double)local_f0;
        getter_01.X0 = (double)uStack_e8;
        getter_01.Offset = (undefined4)local_e0;
        getter_01.Stride = local_e0._4_4_;
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_short>>
                  (getter_01,local_104,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
        break;
      case 3:
        memcpy(&local_130,get_base_local,0x28);
        TransformerLogLog::TransformerLogLog(&local_134);
        getter_02._8_8_ = uStack_128;
        getter_02.Ys = (unsigned_short *)local_130;
        getter_02.XScale = (double)local_120;
        getter_02.X0 = (double)uStack_118;
        getter_02.Offset = (undefined4)local_110;
        getter_02.Stride = local_110._4_4_;
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_short>>
                  (getter_02,local_134,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}